

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

int messagesender_open(MESSAGE_SENDER_HANDLE message_sender)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  int result;
  MESSAGE_SENDER_HANDLE message_sender_local;
  
  if (message_sender == (MESSAGE_SENDER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                ,"messagesender_open",0x329,1,"NULL message_sender");
    }
    l._4_4_ = 0x32a;
  }
  else if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_IDLE) {
    set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_OPENING);
    iVar1 = link_attach(message_sender->link,(ON_TRANSFER_RECEIVED)0x0,on_link_state_changed,
                        on_link_flow_on,message_sender);
    if (iVar1 == 0) {
      l._4_4_ = 0;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                  ,"messagesender_open",0x333,1,"attach link failed");
      }
      l._4_4_ = 0x334;
      set_message_sender_state(message_sender,MESSAGE_SENDER_STATE_ERROR);
    }
  }
  else {
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int messagesender_open(MESSAGE_SENDER_HANDLE message_sender)
{
    int result;

    if (message_sender == NULL)
    {
        LogError("NULL message_sender");
        result = MU_FAILURE;
    }
    else
    {
        if (message_sender->message_sender_state == MESSAGE_SENDER_STATE_IDLE)
        {
            set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_OPENING);
            if (link_attach(message_sender->link, NULL, on_link_state_changed, on_link_flow_on, message_sender) != 0)
            {
                LogError("attach link failed");
                result = MU_FAILURE;
                set_message_sender_state(message_sender, MESSAGE_SENDER_STATE_ERROR);
            }
            else
            {
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}